

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

int j2k_calculate_tp(opj_cp_t *cp,int img_numcomp,opj_image_t *image,opj_j2k_t *j2k)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  opj_pi_iterator_t *poVar4;
  long in_RCX;
  long in_RDI;
  opj_pi_iterator_t *pi;
  int tp_num;
  opj_tcp_t *tcp;
  int cur_totnum_tp;
  int totnum_tp;
  int tileno;
  int pino;
  J2K_T2_MODE in_stack_00000058;
  int in_stack_0000005c;
  opj_cp_t *in_stack_00000060;
  opj_image_t *in_stack_00000068;
  int tileno_00;
  int pino_00;
  int iVar5;
  int iVar6;
  
  pino_00 = 0;
  pvVar2 = malloc((long)(*(int *)(in_RDI + 0x48) * *(int *)(in_RDI + 0x4c)) << 2);
  *(void **)(in_RCX + 0x18) = pvVar2;
  iVar5 = 0;
  do {
    if (*(int *)(in_RDI + 0x48) * *(int *)(in_RDI + 0x4c) <= iVar5) {
      return pino_00;
    }
    tileno_00 = 0;
    lVar3 = *(long *)(in_RDI + 0x80) + (long)iVar5 * 0x15e8;
    for (iVar6 = 0; iVar6 <= *(int *)(lVar3 + 0x1a4); iVar6 = iVar6 + 1) {
      poVar4 = pi_initialise_encode
                         (in_stack_00000068,in_stack_00000060,in_stack_0000005c,in_stack_00000058);
      if (poVar4 == (opj_pi_iterator_t *)0x0) {
        return -1;
      }
      iVar1 = j2k_get_num_tp((opj_cp_t *)CONCAT44(iVar6,iVar5),pino_00,tileno_00);
      pino_00 = pino_00 + iVar1;
      tileno_00 = tileno_00 + iVar1;
      pi_destroy((opj_pi_iterator_t *)CONCAT44(iVar6,iVar5),(opj_cp_t *)CONCAT44(pino_00,tileno_00),
                 (int)((ulong)lVar3 >> 0x20));
    }
    *(int *)(*(long *)(in_RCX + 0x18) + (long)iVar5 * 4) = tileno_00;
    if (*(long *)(in_RCX + 0x68) != 0) {
      *(int *)(*(long *)(*(long *)(in_RCX + 0x68) + 0x68) + (long)iVar5 * 0x260 + 0x254) = tileno_00
      ;
      pvVar2 = malloc((long)tileno_00 * 0x14);
      *(void **)(*(long *)(*(long *)(in_RCX + 0x68) + 0x68) + (long)iVar5 * 0x260 + 600) = pvVar2;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int j2k_calculate_tp(opj_cp_t *cp,int img_numcomp,opj_image_t *image,opj_j2k_t *j2k ){
	int pino,tileno,totnum_tp=0;

	OPJ_ARG_NOT_USED(img_numcomp);

	j2k->cur_totnum_tp = (int *) opj_malloc(cp->tw * cp->th * sizeof(int));
	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		int cur_totnum_tp = 0;
		opj_tcp_t *tcp = &cp->tcps[tileno];
		for(pino = 0; pino <= tcp->numpocs; pino++) {
			int tp_num=0;
			opj_pi_iterator_t *pi = pi_initialise_encode(image, cp, tileno,FINAL_PASS);
			if(!pi) { return -1;}
			tp_num = j2k_get_num_tp(cp,pino,tileno);
			totnum_tp = totnum_tp + tp_num;
			cur_totnum_tp = cur_totnum_tp + tp_num;
			pi_destroy(pi, cp, tileno);
		}
		j2k->cur_totnum_tp[tileno] = cur_totnum_tp;
		/* INDEX >> */
		if (j2k->cstr_info) {
			j2k->cstr_info->tile[tileno].num_tps = cur_totnum_tp;
			j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_malloc(cur_totnum_tp * sizeof(opj_tp_info_t));
		}
		/* << INDEX */
	}
	return totnum_tp;
}